

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict sexp_type_of(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  sexp_conflict x_local;
  sexp_sint_t n_local;
  sexp_conflict self_local;
  sexp_conflict ctx_local;
  sexp_conflict local_8;
  
  if (x == (sexp_conflict)0x0) {
    local_8 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_read_end;
  }
  else if (((ulong)x & 3) == 0) {
    local_8 = *(sexp_conflict *)
               ((long)&((((ctx->value).type.setters)->value).type.getters)->value +
               (ulong)x->tag * 8 + 8);
  }
  else if (((ulong)x & 1) == 1) {
    local_8 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_write_base;
  }
  else if ((x == (sexp_conflict)0x13e) || (x == (sexp_conflict)0x3e)) {
    local_8 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_buf_base;
  }
  else if (((ulong)x & 0xff) == 0x1e) {
    local_8 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_write_end;
  }
  else if ((((ulong)x & 0xf) == 6) || ((((ulong)x & 3) == 0 && (x->tag == 7)))) {
    local_8 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_save_base;
  }
  else {
    local_8 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_read_end;
  }
  return local_8;
}

Assistant:

sexp sexp_type_of (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  if (!x)
    return sexp_type_by_index(ctx, SEXP_OBJECT);
  if (sexp_pointerp(x))
    return sexp_object_type(ctx, x);
  else if (sexp_fixnump(x))
    return sexp_type_by_index(ctx, SEXP_FIXNUM);
  else if (sexp_booleanp(x))
    return sexp_type_by_index(ctx, SEXP_BOOLEAN);
  else if (sexp_charp(x))
    return sexp_type_by_index(ctx, SEXP_CHAR);
#if SEXP_USE_HUFF_SYMS
  else if (sexp_symbolp(x))
    return sexp_type_by_index(ctx, SEXP_SYMBOL);
#endif
#if SEXP_USE_IMMEDIATE_FLONUMS
  else if (sexp_flonump(x))
    return sexp_type_by_index(ctx, SEXP_FLONUM);
#endif
  else
    return sexp_type_by_index(ctx, SEXP_OBJECT);
}